

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

run_container_t * run_container_create_given_capacity(int32_t size)

{
  run_container_t *__ptr;
  rle16_t *prVar1;
  
  __ptr = (run_container_t *)roaring_malloc(0x10);
  if (__ptr == (run_container_t *)0x0) {
LAB_0010f302:
    __ptr = (run_container_t *)0x0;
  }
  else {
    if (size < 1) {
      __ptr->runs = (rle16_t *)0x0;
    }
    else {
      prVar1 = (rle16_t *)roaring_malloc((ulong)(uint)size << 2);
      __ptr->runs = prVar1;
      if (prVar1 == (rle16_t *)0x0) {
        roaring_free(__ptr);
        goto LAB_0010f302;
      }
    }
    __ptr->capacity = size;
    __ptr->n_runs = 0;
  }
  return __ptr;
}

Assistant:

run_container_t *run_container_create_given_capacity(int32_t size) {
    run_container_t *run;
    /* Allocate the run container itself. */
    if ((run = (run_container_t *)roaring_malloc(sizeof(run_container_t))) ==
        NULL) {
        return NULL;
    }
    if (size <= 0) {  // we don't want to rely on malloc(0)
        run->runs = NULL;
    } else if ((run->runs = (rle16_t *)roaring_malloc(sizeof(rle16_t) *
                                                      size)) == NULL) {
        roaring_free(run);
        return NULL;
    }
    run->capacity = size;
    run->n_runs = 0;
    return run;
}